

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcServiceLife::IfcServiceLife(IfcServiceLife *this)

{
  IfcServiceLife *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x118,"IfcServiceLife");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00fd9c30);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>,
             &PTR_construction_vtable_24__00fd9ce0);
  *(undefined8 *)this = 0xfd9b50;
  *(undefined8 *)&this->field_0x118 = 0xfd9c18;
  *(undefined8 *)&this->field_0x88 = 0xfd9b78;
  *(undefined8 *)&this->field_0x98 = 0xfd9ba0;
  *(undefined8 *)&this->field_0xd0 = 0xfd9bc8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0xfd9bf0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x10);
  return;
}

Assistant:

IfcServiceLife() : Object("IfcServiceLife") {}